

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void canvas_doaddtemplate(t_symbol *templatesym,int *p_ntemplates,t_symbol ***p_templatevec)

{
  uint uVar1;
  ulong uVar2;
  t_symbol **pptVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = *p_ntemplates;
  lVar5 = (long)(int)uVar1;
  uVar4 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  do {
    if (uVar4 == uVar2) {
      pptVar3 = (t_symbol **)resizebytes(*p_templatevec,lVar5 * 8,lVar5 * 8 + 8);
      pptVar3[lVar5] = templatesym;
      *p_templatevec = pptVar3;
      *p_ntemplates = uVar1 + 1;
      return;
    }
    pptVar3 = *p_templatevec + uVar2;
    uVar2 = uVar2 + 1;
  } while (*pptVar3 != templatesym);
  return;
}

Assistant:

void canvas_doaddtemplate(t_symbol *templatesym,
    int *p_ntemplates, t_symbol ***p_templatevec)
{
    int n = *p_ntemplates, i;
    t_symbol **templatevec = *p_templatevec;
    for (i = 0; i < n; i++)
        if (templatevec[i] == templatesym)
            return;
    templatevec = (t_symbol **)t_resizebytes(templatevec,
        n * sizeof(*templatevec), (n+1) * sizeof(*templatevec));
    templatevec[n] = templatesym;
    *p_templatevec = templatevec;
    *p_ntemplates = n+1;
}